

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O3

void __thiscall ymfm::ym2203::generate(ym2203 *this,output_data *output,uint32_t numsamples)

{
  uint uVar1;
  int iVar2;
  code *UNRECOVERED_JUMPTABLE;
  uint32_t uVar3;
  long *plVar4;
  int iVar5;
  int iVar6;
  
  if (this->m_fm_samples_per_output == '\0') {
    if (numsamples != 0) {
      iVar5 = 0;
      iVar6 = 0;
      do {
        uVar3 = (this->m_ssg_resampler).m_sampindex;
        uVar1 = (uVar3 + iVar6) / 3;
        if (uVar3 + uVar1 * -3 == iVar5) {
          clock_fm(this);
          iVar2 = (this->m_last_fm).data[0];
LAB_00181b82:
          output->data[0] = iVar2;
        }
        else {
          output->data[0] = (this->m_last_fm).data[0];
          if (uVar3 + uVar1 * -3 + -1 == iVar5) {
            clock_fm(this);
            iVar2 = ((this->m_last_fm).data[0] + output->data[0]) / 2;
            goto LAB_00181b82;
          }
        }
        iVar6 = iVar6 + 1;
        output = output + 1;
        iVar5 = iVar5 + -1;
      } while (-numsamples != iVar5);
    }
  }
  else if (numsamples != 0) {
    uVar3 = 0;
    do {
      if (((this->m_ssg_resampler).m_sampindex + uVar3) % (uint)this->m_fm_samples_per_output == 0)
      {
        clock_fm(this);
      }
      output->data[0] = (this->m_last_fm).data[0];
      uVar3 = uVar3 + 1;
      output = output + 1;
    } while (numsamples != uVar3);
  }
  UNRECOVERED_JUMPTABLE = (code *)(this->m_ssg_resampler).m_resampler;
  plVar4 = (long *)((long)(this->m_ssg_resampler).m_last.data +
                   *(long *)&(this->m_ssg_resampler).field_0x18 + -0x20);
  if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
    UNRECOVERED_JUMPTABLE = *(code **)(UNRECOVERED_JUMPTABLE + *plVar4 + -1);
  }
  (*UNRECOVERED_JUMPTABLE)(plVar4,output + -(ulong)numsamples,numsamples);
  return;
}

Assistant:

void ym2203::generate(output_data *output, uint32_t numsamples)
{
	// FM output is just repeated the prescale number of times; note that
	// 0 is a special 1.5 case
	if (m_fm_samples_per_output != 0)
	{
		for (uint32_t samp = 0; samp < numsamples; samp++, output++)
		{
			if ((m_ssg_resampler.sampindex() + samp) % m_fm_samples_per_output == 0)
				clock_fm();
			output->data[0] = m_last_fm.data[0];
		}
	}
	else
	{
		for (uint32_t samp = 0; samp < numsamples; samp++, output++)
		{
			uint32_t step = (m_ssg_resampler.sampindex() + samp) % 3;
			if (step == 0)
				clock_fm();
			output->data[0] = m_last_fm.data[0];
			if (step == 1)
			{
				clock_fm();
				output->data[0] = (output->data[0] + m_last_fm.data[0]) / 2;
			}
		}
	}

	// resample the SSG as configured
	m_ssg_resampler.resample(output - numsamples, numsamples);
}